

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

size_t __thiscall RenX::Server::getBotCount(Server *this)

{
  bool bVar1;
  pointer pPVar2;
  _Self local_28;
  _Self local_20;
  const_iterator node;
  size_t count;
  Server *this_local;
  
  node._M_node = (_List_node_base *)0x0;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                 (&this->players);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                   (&this->players);
    bVar1 = std::operator==(&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pPVar2 = std::_List_const_iterator<RenX::PlayerInfo>::operator->(&local_20);
    if ((pPVar2->isBot & 1U) != 0) {
      node._M_node = (_List_node_base *)((long)&(node._M_node)->_M_next + 1);
    }
    std::_List_const_iterator<RenX::PlayerInfo>::operator++(&local_20);
  }
  return (size_t)node._M_node;
}

Assistant:

size_t RenX::Server::getBotCount() const {
	size_t count = 0;

	for (auto node = this->players.begin(); node != this->players.end(); ++node) {
		if (node->isBot) {
			++count;
		}
	}

	return count;
	//return RenX::Server::bot_count;
}